

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedTest.cpp
# Opt level: O0

void __thiscall
oout::NamedTest::NamedTest
          (NamedTest *this,string *name,
          list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
          *tests)

{
  undefined1 local_40 [16];
  shared_ptr<const_oout::Test> local_30;
  list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
  *local_20;
  list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
  *tests_local;
  string *name_local;
  NamedTest *this_local;
  
  local_20 = tests;
  tests_local = (list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
                 *)name;
  name_local = (string *)this;
  std::
  make_shared<oout::SuiteTest_const,std::__cxx11::list<std::shared_ptr<oout::Test_const>,std::allocator<std::shared_ptr<oout::Test_const>>>const&>
            ((list<std::shared_ptr<const_oout::Test>,_std::allocator<std::shared_ptr<const_oout::Test>_>_>
              *)local_40);
  std::shared_ptr<oout::Test_const>::shared_ptr<oout::SuiteTest_const,void>
            ((shared_ptr<oout::Test_const> *)&local_30,(shared_ptr<const_oout::SuiteTest> *)local_40
            );
  NamedTest(this,name,&local_30);
  std::shared_ptr<const_oout::Test>::~shared_ptr(&local_30);
  std::shared_ptr<const_oout::SuiteTest>::~shared_ptr((shared_ptr<const_oout::SuiteTest> *)local_40)
  ;
  return;
}

Assistant:

NamedTest::NamedTest(const string &name, const list<shared_ptr<const Test>> &tests)
	: NamedTest(name, make_shared<const SuiteTest>(tests))
{
}